

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O3

void bt_skip_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
                 uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t *puVar4;
  uint32_t *puVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t *local_38;
  
  local_38 = son + cyclic_pos * 2;
  puVar5 = son + (ulong)(cyclic_pos * 2) + 1;
  uVar10 = pos - cur_match;
  if (uVar10 < cyclic_size && depth != 0) {
    uVar3 = 0;
    uVar9 = 0;
    puVar4 = puVar5;
    do {
      uVar2 = 0;
      if (cyclic_pos < uVar10) {
        uVar2 = cyclic_size;
      }
      uVar7 = uVar3;
      if (uVar9 < uVar3) {
        uVar7 = uVar9;
      }
      uVar8 = (ulong)uVar7;
      puVar5 = son + ((cyclic_pos - uVar10) + uVar2) * 2;
      bVar6 = cur[uVar8];
      bVar1 = cur[uVar8 - uVar10];
      while (uVar7 = (uint)uVar8, bVar1 == bVar6) {
        if (len_limit - 1 == uVar7) {
          *local_38 = *puVar5;
          *puVar4 = puVar5[1];
          return;
        }
        uVar8 = (ulong)(uVar7 + 1);
        bVar6 = cur[uVar8];
        bVar1 = cur[uVar8 - uVar10];
      }
      if (bVar1 < bVar6) {
        *local_38 = cur_match;
        local_38 = puVar5 + 1;
        puVar5 = puVar4;
        puVar4 = local_38;
        uVar3 = uVar7;
      }
      else {
        *puVar4 = cur_match;
        puVar4 = puVar5;
        uVar9 = uVar7;
      }
      depth = depth - 1;
      if (depth == 0) break;
      cur_match = *puVar4;
      uVar10 = pos - cur_match;
      puVar4 = puVar5;
    } while (uVar10 < cyclic_size);
  }
  *puVar5 = 0;
  *local_38 = 0;
  return;
}

Assistant:

static void
bt_skip_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size)
{
	uint32_t *ptr0 = son + (cyclic_pos << 1) + 1;
	uint32_t *ptr1 = son + (cyclic_pos << 1);

	uint32_t len0 = 0;
	uint32_t len1 = 0;

	while (true) {
		uint32_t *pair;
		const uint8_t *pb;
		uint32_t len;

		const uint32_t delta = pos - cur_match;
		if (depth-- == 0 || delta >= cyclic_size) {
			*ptr0 = EMPTY_HASH_VALUE;
			*ptr1 = EMPTY_HASH_VALUE;
			return;
		}

		pair = son + ((cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0))
				<< 1);
		pb = cur - delta;
		len = my_min(len0, len1);

		if (pb[len] == cur[len]) {
			while (++len != len_limit)
				if (pb[len] != cur[len])
					break;

			if (len == len_limit) {
				*ptr1 = pair[0];
				*ptr0 = pair[1];
				return;
			}
		}

		if (pb[len] < cur[len]) {
			*ptr1 = cur_match;
			ptr1 = pair + 1;
			cur_match = *ptr1;
			len1 = len;
		} else {
			*ptr0 = cur_match;
			ptr0 = pair;
			cur_match = *ptr0;
			len0 = len;
		}
	}
}